

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O2

uint32_t get_error_values(int inc,int top,char **file,int *line,char **data,int *flags)

{
  uint32_t uVar1;
  ERR_STATE *pEVar2;
  uint uVar3;
  uint uVar4;
  err_error_st *error;
  
  pEVar2 = err_get_state();
  if (pEVar2 == (ERR_STATE *)0x0) {
    return 0;
  }
  uVar3 = pEVar2->top;
  if (pEVar2->bottom == uVar3) {
    return 0;
  }
  if (top == 0) {
    uVar3 = pEVar2->bottom + 1 & 0xf;
  }
  else if (inc != 0) {
    __assert_fail("!inc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err.cc"
                  ,0x9c,
                  "uint32_t get_error_values(int, int, const char **, int *, const char **, int *)")
    ;
  }
  error = pEVar2->errors + uVar3;
  uVar1 = pEVar2->errors[uVar3].packed;
  if (line != (int *)0x0 && file != (char **)0x0) {
    if (error->file == (char *)0x0) {
      *file = "NA";
      uVar4 = 0;
    }
    else {
      *file = error->file;
      uVar4 = (uint)error->line;
    }
    *line = uVar4;
  }
  if (data != (char **)0x0) {
    if (error->data != (char *)0x0) {
      *data = error->data;
      if (flags != (int *)0x0) {
        *flags = 3;
      }
      if (inc == 0) {
        return uVar1;
      }
      if (error->data != (char *)0x0) {
        free(pEVar2->to_free);
        pEVar2->to_free = error->data;
      }
      error->data = (char *)0x0;
      goto LAB_0017ad06;
    }
    *data = "";
    if (flags != (int *)0x0) {
      *flags = 0;
    }
  }
  if (inc == 0) {
    return uVar1;
  }
LAB_0017ad06:
  if (top == 0) {
    err_clear(error);
    pEVar2->bottom = uVar3;
    return uVar1;
  }
  __assert_fail("!top",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err.cc"
                ,0xce,
                "uint32_t get_error_values(int, int, const char **, int *, const char **, int *)");
}

Assistant:

static uint32_t get_error_values(int inc, int top, const char **file, int *line,
                                 const char **data, int *flags) {
  unsigned i = 0;
  ERR_STATE *state;
  struct err_error_st *error;
  uint32_t ret;

  state = err_get_state();
  if (state == NULL || state->bottom == state->top) {
    return 0;
  }

  if (top) {
    assert(!inc);
    // last error
    i = state->top;
  } else {
    i = (state->bottom + 1) % ERR_NUM_ERRORS;
  }

  error = &state->errors[i];
  ret = error->packed;

  if (file != NULL && line != NULL) {
    if (error->file == NULL) {
      *file = "NA";
      *line = 0;
    } else {
      *file = error->file;
      *line = error->line;
    }
  }

  if (data != NULL) {
    if (error->data == NULL) {
      *data = "";
      if (flags != NULL) {
        *flags = 0;
      }
    } else {
      *data = error->data;
      if (flags != NULL) {
        // Without |ERR_FLAG_MALLOCED|, rust-openssl assumes the string has a
        // static lifetime. In both cases, we retain ownership of the string,
        // and the caller is not expected to free it.
        *flags = ERR_FLAG_STRING | ERR_FLAG_MALLOCED;
      }
      // If this error is being removed, take ownership of data from
      // the error. The semantics are such that the caller doesn't
      // take ownership either. Instead the error system takes
      // ownership and retains it until the next call that affects the
      // error queue.
      if (inc) {
        if (error->data != NULL) {
          free(state->to_free);
          state->to_free = error->data;
        }
        error->data = NULL;
      }
    }
  }

  if (inc) {
    assert(!top);
    err_clear(error);
    state->bottom = i;
  }

  return ret;
}